

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  float *pfVar1;
  bool bVar2;
  ImGuiKeyModFlags IVar3;
  ImGuiKeyData *pIVar4;
  byte in_DIL;
  float fVar5;
  int n;
  uint c;
  ImGuiKeyData *keydata;
  int keydata_index;
  ImGuiKey key;
  ImGuiMouseButton button;
  ImVec2 event_pos;
  ImGuiInputEvent *e;
  int event_n;
  ImBitArray<645,_0> key_changed_mask;
  int mouse_button_changed;
  bool text_inputted;
  bool key_changed;
  bool mouse_wheeled;
  bool mouse_moved;
  bool trickle_interleaved_keys_and_text;
  ImGuiIO *io;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  ImGuiIO *in_stack_ffffffffffffff20;
  ImGuiInputEvent *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  uint3 in_stack_ffffffffffffff40;
  uint uVar6;
  int iVar7;
  ImVec2 local_98;
  ImVec2 local_90;
  ImGuiInputEvent *local_88;
  int local_7c;
  uint local_24;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  ImGuiIO *local_18;
  ImGuiContext *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_10 = GImGui;
  local_18 = &GImGui->IO;
  uVar6 = (uint)in_stack_ffffffffffffff40;
  if (local_1 != 0) {
    uVar6 = CONCAT13(GImGui->WantTextInputNextFrame == 1,in_stack_ffffffffffffff40);
  }
  local_19 = (byte)(uVar6 >> 0x18);
  local_1a = 0;
  local_1b = 0;
  local_1c = 0;
  local_1d = 0;
  local_24 = 0;
  ImBitArray<645,_0>::ImBitArray((ImBitArray<645,_0> *)0x11cfce);
  for (local_7c = 0; local_7c < (local_10->InputEventsQueue).Size; local_7c = local_7c + 1) {
    local_88 = ImVector<ImGuiInputEvent>::operator[](&local_10->InputEventsQueue,local_7c);
    if (local_88->Type == ImGuiInputEventType_MousePos) {
      ImVec2::ImVec2(&local_90,(local_88->field_2).MousePos.PosX,(local_88->field_2).MousePos.PosY);
      bVar2 = IsMousePosValid(&local_90);
      if (bVar2) {
        in_stack_ffffffffffffff3c = ImFloorSigned(local_90.x);
        fVar5 = ImFloorSigned(local_90.y);
        ImVec2::ImVec2(&local_98,in_stack_ffffffffffffff3c,fVar5);
        local_90 = local_98;
      }
      fVar5 = (local_18->MousePos).x;
      if ((fVar5 == local_90.x) && (!NAN(fVar5) && !NAN(local_90.x))) {
        fVar5 = (local_18->MousePos).y;
        if ((fVar5 == local_90.y) && (!NAN(fVar5) && !NAN(local_90.y))) goto LAB_0011d59e;
      }
      if (((local_1 & 1) != 0) &&
         ((((local_24 != 0 || ((local_1b & 1) != 0)) || ((local_1c & 1) != 0)) ||
          ((local_1d & 1) != 0)))) break;
      local_18->MousePos = local_90;
      local_1a = 1;
    }
    else if (local_88->Type == ImGuiInputEventType_MouseButton) {
      iVar7 = (local_88->field_2).MouseButton.Button;
      if ((local_18->MouseDown[iVar7] & 1U) != ((local_88->field_2).MouseButton.Down & 1U)) {
        if (((local_1 & 1) != 0) &&
           (((local_24 & 1 << ((byte)iVar7 & 0x1f)) != 0 || ((local_1b & 1) != 0)))) break;
        local_18->MouseDown[iVar7] = (bool)((local_88->field_2).MouseButton.Down & 1);
        local_24 = 1 << ((byte)iVar7 & 0x1f) | local_24;
      }
    }
    else if (local_88->Type == ImGuiInputEventType_MouseWheel) {
      fVar5 = (local_88->field_2).MousePos.PosX;
      if (((fVar5 != 0.0) || (NAN(fVar5))) ||
         ((fVar5 = (local_88->field_2).MousePos.PosY, fVar5 != 0.0 || (NAN(fVar5))))) {
        if (((local_1 & 1) != 0) && (((local_1b & 1) != 0 || (local_24 != 0)))) break;
        local_18->MouseWheelH = (local_88->field_2).MousePos.PosX + local_18->MouseWheelH;
        local_18->MouseWheel = (local_88->field_2).MousePos.PosY + local_18->MouseWheel;
        local_1b = 1;
      }
    }
    else if (local_88->Type == ImGuiInputEventType_Key) {
      iVar7 = (local_88->field_2).MouseButton.Button;
      pIVar4 = local_18->KeysData + iVar7;
      if ((((pIVar4->Down & 1U) != ((local_88->field_2).MouseButton.Down & 1U)) ||
          (pfVar1 = &(local_88->field_2).Key.AnalogValue, pIVar4->AnalogValue != *pfVar1)) ||
         (NAN(pIVar4->AnalogValue) || NAN(*pfVar1))) {
        if ((((local_1 & 1) != 0) &&
            ((pIVar4->Down & 1U) != ((local_88->field_2).MouseButton.Down & 1U))) &&
           ((bVar2 = ImBitArray<645,_0>::TestBit
                               ((ImBitArray<645,_0> *)in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff1c), bVar2 ||
            (((local_1d & 1) != 0 || (local_24 != 0)))))) break;
        pIVar4->Down = (bool)((local_88->field_2).MouseButton.Down & 1);
        pIVar4->AnalogValue = (local_88->field_2).Key.AnalogValue;
        local_1c = 1;
        ImBitArray<645,_0>::SetBit
                  ((ImBitArray<645,_0> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        if ((iVar7 == 0x281) || (((iVar7 == 0x282 || (iVar7 == 0x283)) || (iVar7 == 0x284)))) {
          if (iVar7 == 0x281) {
            local_18->KeyCtrl = (bool)(pIVar4->Down & 1);
          }
          if (iVar7 == 0x282) {
            local_18->KeyShift = (bool)(pIVar4->Down & 1);
          }
          if (iVar7 == 0x283) {
            local_18->KeyAlt = (bool)(pIVar4->Down & 1);
          }
          if (iVar7 == 0x284) {
            local_18->KeySuper = (bool)(pIVar4->Down & 1);
          }
          IVar3 = GetMergedKeyModFlags();
          local_18->KeyMods = IVar3;
        }
        local_18->KeysDown[iVar7] = (bool)(pIVar4->Down & 1);
        if (local_18->KeyMap[iVar7] != -1) {
          local_18->KeysDown[local_18->KeyMap[iVar7]] = (bool)(pIVar4->Down & 1);
        }
      }
    }
    else if (local_88->Type == ImGuiInputEventType_Text) {
      if (((local_1 & 1) != 0) &&
         (((((local_1c & 1) != 0 && ((local_19 & 1) != 0)) || (local_24 != 0)) ||
          (((local_1a & 1) != 0 || ((local_1b & 1) != 0)))))) break;
      in_stack_ffffffffffffff30 = (ImGuiInputEvent *)&local_18->InputQueueCharacters;
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)in_stack_ffffffffffffff20,
                 (unsigned_short *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if ((local_19 & 1) != 0) {
        local_1d = 1;
      }
    }
    else if (local_88->Type == ImGuiInputEventType_Focus) {
      local_18->AppFocusLost = (bool)(((local_88->field_2).AppFocused.Focused ^ 0xffU) & 1);
    }
LAB_0011d59e:
  }
  for (iVar7 = 0; iVar7 < local_7c; iVar7 = iVar7 + 1) {
    in_stack_ffffffffffffff20 = (ImGuiIO *)&local_10->InputEventsTrail;
    ImVector<ImGuiInputEvent>::operator[](&local_10->InputEventsQueue,iVar7);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)in_stack_ffffffffffffff20,
               (ImGuiInputEvent *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (local_7c == (local_10->InputEventsQueue).Size) {
    ImVector<ImGuiInputEvent>::resize
              ((ImVector<ImGuiInputEvent> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  else {
    ImVector<ImGuiInputEvent>::erase
              ((ImVector<ImGuiInputEvent> *)CONCAT44(iVar7,uVar6),
               (ImGuiInputEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
  }
  if (((local_10->IO).AppFocusLost & 1U) != 0) {
    ImGuiIO::ClearInputKeys(in_stack_ffffffffffffff20);
    (local_10->IO).AppFocusLost = false;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        const ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (IsMousePosValid(&event_pos))
                event_pos = ImVec2(ImFloorSigned(event_pos.x), ImFloorSigned(event_pos.y)); // Apply same flooring as UpdateMouseInputs()
            if (io.MousePos.x != event_pos.x || io.MousePos.y != event_pos.y)
            {
                // Trickling Rule: Stop processing queued events if we already handled a mouse button change
                if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                    break;
                io.MousePos = event_pos;
                mouse_moved = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (io.MouseDown[button] != e->MouseButton.Down)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                    break;
                io.MouseDown[button] = e->MouseButton.Down;
                mouse_button_changed |= (1 << button);
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            if (e->MouseWheel.WheelX != 0.0f || e->MouseWheel.WheelY != 0.0f)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the event
                if (trickle_fast_inputs && (mouse_wheeled || mouse_button_changed != 0))
                    break;
                io.MouseWheelH += e->MouseWheel.WheelX;
                io.MouseWheel += e->MouseWheel.WheelY;
                mouse_wheeled = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            const int keydata_index = (key - ImGuiKey_KeysData_OFFSET);
            ImGuiKeyData* keydata = &io.KeysData[keydata_index];
            if (keydata->Down != e->Key.Down || keydata->AnalogValue != e->Key.AnalogValue)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && keydata->Down != e->Key.Down && (key_changed_mask.TestBit(keydata_index) || text_inputted || mouse_button_changed != 0))
                    break;
                keydata->Down = e->Key.Down;
                keydata->AnalogValue = e->Key.AnalogValue;
                key_changed = true;
                key_changed_mask.SetBit(keydata_index);

                if (key == ImGuiKey_ModCtrl || key == ImGuiKey_ModShift || key == ImGuiKey_ModAlt || key == ImGuiKey_ModSuper)
                {
                    if (key == ImGuiKey_ModCtrl) { io.KeyCtrl = keydata->Down; }
                    if (key == ImGuiKey_ModShift) { io.KeyShift = keydata->Down; }
                    if (key == ImGuiKey_ModAlt) { io.KeyAlt = keydata->Down; }
                    if (key == ImGuiKey_ModSuper) { io.KeySuper = keydata->Down; }
                    io.KeyMods = GetMergedKeyModFlags();
                }

                // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
                io.KeysDown[key] = keydata->Down;
                if (io.KeyMap[key] != -1)
                    io.KeysDown[io.KeyMap[key]] = keydata->Down;
#endif
            }
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process lower, in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            io.AppFocusLost = !e->AppFocused.Focused;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
    /*if (event_n != 0)
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugLogInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);*/

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }
}